

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_23::c_input_test_2ints::~c_input_test_2ints(c_input_test_2ints *this)

{
  c_input_test_2ints *this_local;
  
  ~c_input_test_2ints(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      std::stringstream str, str2;
      std::string script = R"(
(c-input "(int a, int b) " )

(+ a b)
)";
      bool error = false;
      asmcode code;
      try
        {
        code = get_asmcode(script);
        }
      catch (std::logic_error e)
        {
        error = true;
        str << e.what();
        }
      if (!error)
        {
        first_pass_data d;
        uint64_t size;
        fun_ptr f = (fun_ptr)assemble(size, d, code);
        if (f)
          {
          uint64_t res = f(&ctxt, (int64_t)3, (int64_t)6);
          scheme_runtime(res, str, env, rd, nullptr);

          uint64_t res2 = f(&ctxt, (int64_t)40000000000, (int64_t)50000000000);
          scheme_runtime(res2, str2, env, rd, nullptr);

          compiled_functions.emplace_back(f, size);
          }
        }
      TEST_EQ("9", str.str());
      TEST_EQ("90000000000", str2.str());
      }